

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

int ast_parse_expression_with_parentheses(lgx_ast_t *ast,lgx_ast_node_t *parent)

{
  int iVar1;
  lgx_ast_node_t *parent_local;
  lgx_ast_t *ast_local;
  
  if (ast->cur_token == TK_LEFT_PAREN) {
    ast_step(ast);
    iVar1 = ast_parse_sub_expression(ast,parent,0xf);
    if (iVar1 == 0) {
      if (ast->cur_token == TK_RIGHT_PAREN) {
        ast_step(ast);
        ast_local._4_4_ = 0;
      }
      else {
        ast_error(ast,"\')\' expected before `%.*s`\n",(ulong)(uint)ast->cur_length,ast->cur_start);
        ast_local._4_4_ = 1;
      }
    }
    else {
      ast_local._4_4_ = 1;
    }
  }
  else {
    ast_error(ast,"\'(\' expected before `%.*s`\n",(ulong)(uint)ast->cur_length,ast->cur_start);
    ast_local._4_4_ = 1;
  }
  return ast_local._4_4_;
}

Assistant:

static int ast_parse_expression_with_parentheses(lgx_ast_t* ast, lgx_ast_node_t* parent) {
    if (ast->cur_token != TK_LEFT_PAREN) {
        ast_error(ast, "'(' expected before `%.*s`\n", ast->cur_length, ast->cur_start);
        return 1;
    }
    ast_step(ast);

    if (ast_parse_sub_expression(ast, parent, 15)) {
        return 1;
    }

    if (ast->cur_token != TK_RIGHT_PAREN) {
        ast_error(ast, "')' expected before `%.*s`\n", ast->cur_length, ast->cur_start);
        return 1;
    }
    ast_step(ast);

    return 0;
}